

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemView::initViewItemOption(QAbstractItemView *this,QStyleOptionViewItem *option)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  QLocale QVar4;
  bool bVar5;
  int iVar6;
  QSize QVar7;
  QStyle *pQVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QLocale local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(this + 8);
  QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
  pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                           super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                           super_QFlagsStorage<QStyle::StateFlag>.i + 1);
  *pbVar1 = *pbVar1 & 0xdf;
  QFont::operator=(&option->font,(QFont *)(*(long *)(this + 0x20) + 0x38));
  bVar5 = QWidget::hasFocus((QWidget *)this);
  uVar2 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  uVar9 = uVar2 & 0xfffefeff;
  if (bVar5) {
    uVar9 = uVar2;
  }
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = uVar9 & 0xfffffeff;
  if ((*(int *)(lVar3 + 0x42c) < 0) || (*(int *)(lVar3 + 0x430) < 0)) {
    pQVar8 = QWidget::style((QWidget *)this);
    QVar7.wd.m_i = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x3e,0,this);
    QVar7.ht.m_i = QVar7.wd.m_i;
  }
  else {
    QVar7 = *(QSize *)(lVar3 + 0x42c);
  }
  option->decorationSize = QVar7;
  option->decorationPosition = Left;
  option->displayAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x81;
  option->decorationAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x84;
  option->textElideMode = *(TextElideMode *)(lVar3 + 0x434);
  (option->super_QStyleOption).rect.x1 = 0;
  (option->super_QStyleOption).rect.y1 = 0;
  (option->super_QStyleOption).rect.x2 = -1;
  (option->super_QStyleOption).rect.y2 = -1;
  pQVar8 = QWidget::style((QWidget *)this);
  iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x3c,0,this,0);
  option->showDecorationSelected = iVar6 != 0;
  if (*(char *)(lVar3 + 0x491) == '\x01') {
    (option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
    super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i = 1;
  }
  QWidget::locale(&local_30,(QWidget *)this);
  QVar4 = option->locale;
  option->locale = local_30;
  local_30 = QVar4;
  QLocale::~QLocale(&local_30);
  QLocale::setNumberOptions(&option->locale,1);
  option->widget = (QWidget *)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_D(const QAbstractItemView);
    option->initFrom(this);
    option->state &= ~QStyle::State_MouseOver;
    option->font = font();

    // On mac the focus appearance follows window activation
    // not widget activation
    if (!hasFocus())
        option->state &= ~QStyle::State_Active;

    option->state &= ~QStyle::State_HasFocus;
    if (d->iconSize.isValid()) {
        option->decorationSize = d->iconSize;
    } else {
        int pm = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, this);
        option->decorationSize = QSize(pm, pm);
    }
    option->decorationPosition = QStyleOptionViewItem::Left;
    option->decorationAlignment = Qt::AlignCenter;
    option->displayAlignment = Qt::AlignLeft|Qt::AlignVCenter;
    option->textElideMode = d->textElideMode;
    option->rect = QRect();
    option->showDecorationSelected = style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected, nullptr, this);
    if (d->wrapItemText)
        option->features = QStyleOptionViewItem::WrapText;
    option->locale = locale();
    option->locale.setNumberOptions(QLocale::OmitGroupSeparator);
    option->widget = this;
}